

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O3

void set_save(FILE *f,set_t set)

{
  int k;
  size_t dd;
  undefined4 local_1c;
  size_t local_18;
  
  local_1c = 0xffffffff;
  fwrite(&local_1c,4,1,(FILE *)f);
  local_18 = lddmc_serialize_add(set->dd);
  lddmc_serialize_tofile(f);
  fwrite(&local_18,8,1,(FILE *)f);
  return;
}

Assistant:

static void
set_save(FILE* f, set_t set)
{
    int k = -1;
    fwrite(&k, sizeof(int), 1, f);
    size_t dd = lddmc_serialize_add(set->dd);
    lddmc_serialize_tofile(f);
    fwrite(&dd, sizeof(size_t), 1, f);
}